

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GenericValue(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,Ch *s,SizeType length,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  GenericStringRef<char> s_00;
  
  (this->data_).s.str = (Ch *)0x0;
  *(undefined8 *)((long)&this->data_ + 8) = 0;
  this->flags_ = 0;
  s_00 = StringRef<char>(s,(ulong)length);
  SetStringRaw(this,s_00,allocator);
  return;
}

Assistant:

GenericValue(const Ch* s, SizeType length, Allocator& allocator) : data_(), flags_() { SetStringRaw(StringRef(s, length), allocator); }